

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::GroupNode> *group,ssize_t id)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  pointer pRVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  ulong uVar8;
  Ref<embree::SceneGraph::Node> child;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  object_to_transform_map;
  key_type local_110;
  value_type local_108;
  Ref<embree::SceneGraph::Node> local_100;
  vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
  local_f8;
  vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
  local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  local_98;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
  local_48;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Group","");
  open(this,(char *)local_68,(int)id);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  p_Var1 = &local_98._M_impl.super__Rb_tree_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  pRVar4 = (group->ptr->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if ((group->ptr->children).
      super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar4) {
    uVar8 = 0;
    do {
      if (pRVar4[uVar8].ptr == (Node *)0x0) {
        local_108.ptr = (TransformNode *)0x0;
      }
      else {
        local_108.ptr =
             (TransformNode *)
             __dynamic_cast(pRVar4[uVar8].ptr,&SceneGraph::Node::typeinfo,
                            &SceneGraph::TransformNode::typeinfo,0);
      }
      if (local_108.ptr != (TransformNode *)0x0) {
        (*((local_108.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(local_108.ptr);
      }
      bVar2 = true;
      if (((local_108.ptr != (TransformNode *)0x0) &&
          (((local_108.ptr)->spaces).spaces.size_active == 1)) &&
         (((local_108.ptr)->super_Node).indegree == 1)) {
        local_110.ptr = ((local_108.ptr)->child).ptr;
        p_Var6 = &p_Var1->_M_header;
        p_Var3 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (local_110.ptr != (Node *)0x0) {
          (*((local_110.ptr)->super_RefCount)._vptr_RefCount[2])();
          p_Var3 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
        for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
            p_Var3 = (&p_Var3->_M_left)[*(Node **)(p_Var3 + 1) < local_110.ptr]) {
          if (*(Node **)(p_Var3 + 1) >= local_110.ptr) {
            p_Var6 = p_Var3;
          }
        }
        p_Var7 = p_Var1;
        if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
           (p_Var7 = (_Rb_tree_header *)p_Var6,
           local_110.ptr < (Node *)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
          p_Var7 = p_Var1;
        }
        if (p_Var7 == p_Var1) {
          local_f8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pmVar5 = std::
                   map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
                   ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
                                 *)&local_98,&local_110);
          local_d8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pmVar5->
               super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_d8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pmVar5->
               super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_d8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pmVar5->
               super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pmVar5->
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          )._M_impl.super__Vector_impl_data._M_start =
               local_f8.
               super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (pmVar5->
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          )._M_impl.super__Vector_impl_data._M_finish =
               local_f8.
               super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (pmVar5->
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_f8.
               super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_f8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ::~vector(&local_d8);
          std::
          vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ::~vector(&local_f8);
        }
        pmVar5 = std::
                 map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
                 ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
                               *)&local_98,&local_110);
        std::
        vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
        ::push_back(pmVar5,&local_108);
        if (local_110.ptr != (Node *)0x0) {
          (*((local_110.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        bVar2 = false;
      }
      if (local_108.ptr != (TransformNode *)0x0) {
        (*((local_108.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      if (bVar2) {
        local_100.ptr =
             (group->ptr->children).
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar8].ptr;
        if (local_100.ptr != (Node *)0x0) {
          (*((local_100.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        store(this,&local_100);
        if (local_100.ptr != (Node *)0x0) {
          (*((local_100.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
      }
      uVar8 = uVar8 + 1;
      pRVar4 = (group->ptr->children).
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(group->ptr->children).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 3));
  }
  if ((_Rb_tree_header *)local_98._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var6 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::
      vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
      ::vector(&local_48,
               (vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
                *)&p_Var6[1]._M_parent);
      store(this,&local_48);
      std::
      vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
      ::~vector(&local_48);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Group","");
  close(this,(int)local_b8);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  std::
  _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  ::~_Rb_tree(&local_98);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::GroupNode> group, ssize_t id)
  {
    open("Group",id);

    std::map<Ref<SceneGraph::Node>,std::vector<Ref<SceneGraph::TransformNode>>> object_to_transform_map;
    for (size_t i=0; i<group->children.size(); i++)
    {
      /* compress transformation of the same object into MultiTransform nodes if possible */
      if (Ref<SceneGraph::TransformNode> xfmNode = group->children[i].dynamicCast<SceneGraph::TransformNode>())
      {
        /* we can only compress non-animated transform nodes and only ones that are referenced once */
        if (xfmNode->spaces.size() == 1 && xfmNode->indegree == 1) 
        {
          Ref<SceneGraph::Node> child = xfmNode->child;
          if (object_to_transform_map.find(child) == object_to_transform_map.end()) {
            object_to_transform_map[child] = std::vector<Ref<SceneGraph::TransformNode>>();
          }
          object_to_transform_map[child].push_back(xfmNode);
          continue;
        }
      }
      store(group->children[i]);
    }
    
    /* store all compressed transform nodes */
    for (auto& i : object_to_transform_map)
      store(i.second);

    close("Group");
  }